

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

void __thiscall spvtools::opt::LoopPeeling::PeelBefore(LoopPeeling *this,uint32_t peel_factor)

{
  BasicBlock *pBVar1;
  IRContext *this_00;
  iterator instr;
  Loop *this_01;
  bool bVar2;
  char cVar3;
  uint32_t uVar4;
  uint32_t true_value;
  uint32_t false_value;
  uint uVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  BasicBlock *pBVar8;
  uint32_t uVar9;
  InstructionBuilder builder;
  LoopCloningResult clone_results;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  Instruction *local_178;
  Instruction *local_170;
  long *local_168;
  undefined8 uStack_160;
  code *local_158;
  code *pcStack_150;
  InstructionBuilder local_148;
  LoopCloningResult local_128;
  
  bVar2 = CanPeelLoop(this);
  if (!bVar2) {
    __assert_fail("CanPeelLoop() && \"Cannot peel loop\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x19f,"void spvtools::opt::LoopPeeling::PeelBefore(uint32_t)");
  }
  local_128.ptr_map_._M_h._M_buckets = &local_128.ptr_map_._M_h._M_single_bucket;
  local_128.ptr_map_._M_h._M_bucket_count = 1;
  local_128.ptr_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.ptr_map_._M_h._M_element_count = 0;
  local_128.ptr_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.ptr_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.ptr_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.value_map_._M_h._M_buckets = &local_128.value_map_._M_h._M_single_bucket;
  local_128.value_map_._M_h._M_bucket_count = 1;
  local_128.value_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.value_map_._M_h._M_element_count = 0;
  local_128.value_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.value_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.value_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.old_to_new_bb_._M_h._M_buckets = &local_128.old_to_new_bb_._M_h._M_single_bucket;
  local_128.old_to_new_bb_._M_h._M_bucket_count = 1;
  local_128.old_to_new_bb_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.old_to_new_bb_._M_h._M_element_count = 0;
  local_128.old_to_new_bb_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.old_to_new_bb_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.old_to_new_bb_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.new_to_old_bb_._M_h._M_buckets = &local_128.new_to_old_bb_._M_h._M_single_bucket;
  local_128.new_to_old_bb_._M_h._M_bucket_count = 1;
  local_128.new_to_old_bb_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.new_to_old_bb_._M_h._M_element_count = 0;
  local_128.new_to_old_bb_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.cloned_bb_.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.cloned_bb_.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.new_to_old_bb_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.new_to_old_bb_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.cloned_bb_.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DuplicateAndConnectLoop(this,&local_128);
  InsertCanonicalInductionVariable(this,&local_128);
  pBVar1 = this->cloned_loop_->loop_preheader_;
  pIVar6 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar6 == (Instruction *)0x0) ||
     ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  this_00 = this->context_;
  instr.node_ = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  local_148.parent_ = IRContext::get_instr_block(this_00,instr.node_);
  local_148.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  local_148.context_ = this_00;
  local_148.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
  pIVar6 = InstructionBuilder::GetIntConstant<unsigned_int>
                     (&local_148,peel_factor,this->int_type_->signed_);
  uVar9 = 0;
  uVar4 = 0;
  if (pIVar6->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
  }
  pIVar7 = this->loop_iteration_count_;
  if (pIVar7->has_result_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  pIVar7 = InstructionBuilder::AddLessThan(&local_148,uVar4,uVar9);
  uVar9 = 0;
  uVar4 = 0;
  if (pIVar6->has_type_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar6,0);
  }
  if (pIVar7->has_result_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  false_value = 0;
  true_value = 0;
  local_178 = pIVar7;
  if (pIVar6->has_result_id_ == true) {
    true_value = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
  }
  pIVar6 = this->loop_iteration_count_;
  if (pIVar6->has_result_id_ == true) {
    false_value = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
  }
  local_198._M_unused._M_object =
       InstructionBuilder::AddSelect(&local_148,uVar4,uVar9,true_value,false_value);
  pcStack_180 = std::
                _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:439:20)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:439:20)>
              ::_M_manager;
  local_198._8_8_ = this;
  FixExitCondition(this,(function<unsigned_int_(spvtools::opt::Instruction_*)> *)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  this_01 = this->loop_;
  pBVar1 = this_01->loop_merge_;
  pBVar8 = CreateBlockBefore(this,pBVar1);
  Loop::SetMergeBlock(this_01,pBVar8);
  pBVar8 = ProtectLoop(this,this->loop_,local_178,pBVar1);
  local_158 = (code *)0x0;
  pcStack_150 = (code *)0x0;
  local_168 = (long *)0x0;
  uStack_160 = 0;
  local_168 = (long *)operator_new(0x18);
  *local_168 = (long)&local_128;
  local_168[1] = (long)pBVar8;
  local_168[2] = (long)this;
  pcStack_150 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:458:7)>
                ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:458:7)>
              ::_M_manager;
  local_198._8_8_ = 0;
  pcStack_180 = std::
                _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
              ::_M_manager;
  pIVar6 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_198._M_unused._M_object = &local_168;
  if ((pIVar6 != (Instruction *)0x0) &&
     ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar6 == (Instruction *)0x0) break;
      pIVar7 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      cVar3 = '\0';
      if ((pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar7 = (Instruction *)0x0;
      }
      if (pIVar6->opcode_ == OpPhi) {
        local_170 = pIVar6;
        if (local_188 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        uVar5 = (*pcStack_180)(&local_198,&local_170);
        cVar3 = (char)uVar5;
        if (cVar3 != '\0') {
          pIVar6 = pIVar7;
        }
      }
    } while (cVar3 != '\0');
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,3);
  }
  IRContext::InvalidateAnalysesExceptFor
            (this->context_,
             kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::~vector(&local_128.cloned_bb_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128.new_to_old_bb_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128.old_to_new_bb_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128.value_map_._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_128);
  return;
}

Assistant:

void LoopPeeling::PeelBefore(uint32_t peel_factor) {
  assert(CanPeelLoop() && "Cannot peel loop");
  LoopUtils::LoopCloningResult clone_results;

  // Clone the loop and insert the cloned one before the loop.
  DuplicateAndConnectLoop(&clone_results);

  // Add a canonical induction variable "canonical_induction_variable_".
  InsertCanonicalInductionVariable(&clone_results);

  InstructionBuilder builder(
      context_, &*cloned_loop_->GetPreHeaderBlock()->tail(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* factor =
      builder.GetIntConstant(peel_factor, int_type_->IsSigned());

  Instruction* has_remaining_iteration = builder.AddLessThan(
      factor->result_id(), loop_iteration_count_->result_id());
  Instruction* max_iteration = builder.AddSelect(
      factor->type_id(), has_remaining_iteration->result_id(),
      factor->result_id(), loop_iteration_count_->result_id());

  // Change the exit condition of the cloned loop to be (exit when become
  // false):
  //  "canonical_induction_variable_" < min("factor", "loop_iteration_count_")
  FixExitCondition([max_iteration, this](Instruction* insert_before_point) {
    return InstructionBuilder(context_, insert_before_point,
                              IRContext::kAnalysisDefUse |
                                  IRContext::kAnalysisInstrToBlockMapping)
        .AddLessThan(canonical_induction_variable_->result_id(),
                     max_iteration->result_id())
        ->result_id();
  });

  // "Protect" the second loop: the second loop can only be executed if
  // |has_remaining_iteration| is true (i.e. factor < loop_iteration_count_).
  BasicBlock* if_merge_block = loop_->GetMergeBlock();
  loop_->SetMergeBlock(CreateBlockBefore(loop_->GetMergeBlock()));
  // Prevent the second loop from being executed if we already executed all the
  // required iterations.
  BasicBlock* if_block =
      ProtectLoop(loop_, has_remaining_iteration, if_merge_block);
  // Patch the phi of the merge block.
  if_merge_block->ForEachPhiInst(
      [&clone_results, if_block, this](Instruction* phi) {
        // if_merge_block had previously only 1 predecessor.
        uint32_t incoming_value = phi->GetSingleWordInOperand(0);
        auto def_in_loop = clone_results.value_map_.find(incoming_value);
        if (def_in_loop != clone_results.value_map_.end())
          incoming_value = def_in_loop->second;
        phi->AddOperand(
            {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {incoming_value}});
        phi->AddOperand(
            {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {if_block->id()}});
        context_->get_def_use_mgr()->AnalyzeInstUse(phi);
      });

  context_->InvalidateAnalysesExceptFor(
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping |
      IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisCFG);
}